

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

void __thiscall
Frame::TracePointers(Frame *this,function<void_(std::tuple<const_char_*,_Sexp_**>)> *func)

{
  vector<Sexp_*,_std::allocator<Sexp_*>_> *this_00;
  bool bVar1;
  reference __t;
  __tuple_element_t<1UL,_tuple<const_char_*,_vector<Sexp_*,_allocator<Sexp_*>_>_*>_> *ppvVar2;
  Sexp ***__args_1;
  tuple<const_char_*,_Sexp_**> local_a0;
  reference local_90;
  Sexp **loc;
  Sexp **root;
  iterator __end2;
  iterator __begin2;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *__range2;
  tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*> *vec;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
  *__range1_1;
  _Head_base<0UL,_const_char_*,_false> local_40;
  reference local_38;
  tuple<const_char_*,_Sexp_**> *it;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
  *__range1;
  function<void_(std::tuple<const_char_*,_Sexp_**>)> *func_local;
  Frame *this_local;
  
  __end1 = std::
           vector<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
           ::begin(&this->roots);
  it = (tuple<const_char_*,_Sexp_**> *)
       std::
       vector<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
       ::end(&this->roots);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::tuple<const_char_*,_Sexp_**>_*,_std::vector<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>_>
                                *)&it);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::tuple<const_char_*,_Sexp_**>_*,_std::vector<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>_>
               ::operator*(&__end1);
    __range1_1 = (vector<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
                  *)(local_38->super__Tuple_impl<0UL,_const_char_*,_Sexp_**>).
                    super__Tuple_impl<1UL,_Sexp_**>.super__Head_base<1UL,_Sexp_**,_false>.
                    _M_head_impl;
    local_40._M_head_impl =
         (local_38->super__Tuple_impl<0UL,_const_char_*,_Sexp_**>).
         super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
    std::function<void_(std::tuple<const_char_*,_Sexp_**>)>::operator()
              (func,(tuple<const_char_*,_Sexp_**> *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<std::tuple<const_char_*,_Sexp_**>_*,_std::vector<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
             ::begin(&this->vector_roots);
  vec = (tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*> *)
        std::
        vector<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
        ::end(&this->vector_roots);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_*,_std::vector<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>_>
                        *)&vec);
    if (!bVar1) break;
    __t = __gnu_cxx::
          __normal_iterator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_*,_std::vector<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>_>
          ::operator*(&__end1_1);
    ppvVar2 = std::get<1ul,char_const*,std::vector<Sexp*,std::allocator<Sexp*>>*>(__t);
    this_00 = *ppvVar2;
    __end2 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::begin(this_00);
    root = (Sexp **)std::vector<Sexp_*,_std::allocator<Sexp_*>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>
                                  *)&root);
      if (!bVar1) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::
                 operator*(&__end2);
      loc = local_90;
      __args_1 = (Sexp ***)std::get<0ul,char_const*,std::vector<Sexp*,std::allocator<Sexp*>>*>(__t);
      std::make_tuple<char_const*&,Sexp**&>((char **)&local_a0,__args_1);
      std::function<void_(std::tuple<const_char_*,_Sexp_**>)>::operator()(func,&local_a0);
      __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_*,_std::vector<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void
  TracePointers(std::function<void(std::tuple<const char *, Sexp **>)> func) {
    for (auto &it : roots) {
      func(it);
    }

    for (auto &vec : vector_roots) {
      for (auto &root : *std::get<1>(vec)) {
        Sexp **loc = &root;
        func(std::make_tuple(std::get<0>(vec), loc));
      }
    }
  }